

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTests.cpp
# Opt level: O1

void __thiscall
solitaire::cards::ValueTests_to_string_Test::~ValueTests_to_string_Test
          (ValueTests_to_string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValueTests, to_string) {
    EXPECT_EQ(to_string(Value::Ace), "Ace");
    EXPECT_EQ(to_string(Value::Two), "Two");
    EXPECT_EQ(to_string(Value::Three), "Three");
    EXPECT_EQ(to_string(Value::Four), "Four");
    EXPECT_EQ(to_string(Value::Five), "Five");
    EXPECT_EQ(to_string(Value::Six), "Six");
    EXPECT_EQ(to_string(Value::Seven), "Seven");
    EXPECT_EQ(to_string(Value::Eight), "Eight");
    EXPECT_EQ(to_string(Value::Nine), "Nine");
    EXPECT_EQ(to_string(Value::Ten), "Ten");
    EXPECT_EQ(to_string(Value::Jack), "Jack");
    EXPECT_EQ(to_string(Value::Queen), "Queen");
    EXPECT_EQ(to_string(Value::King), "King");
    EXPECT_EQ(to_string(Value {100}), "Unknown");
}